

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::Command>::Inserter::insertOne
          (Inserter *this,qsizetype pos,Command *t)

{
  undefined8 *puVar1;
  Command *pCVar2;
  qsizetype qVar3;
  Command *pCVar4;
  undefined8 uVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  Data *pDVar8;
  TypedName *pTVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  pCVar2 = this->begin;
  lVar11 = this->size;
  pCVar4 = pCVar2 + lVar11;
  this->end = pCVar4;
  this->last = pCVar2 + lVar11 + -1;
  this->where = pCVar2 + pos;
  lVar11 = lVar11 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (lVar11 < 1) {
    this->sourceCopyConstruct = 1 - lVar11;
    this->move = 0;
    this->sourceCopyAssign = lVar11;
    pDVar6 = (t->cmd).name.d.d;
    (t->cmd).name.d.d = (Data *)0x0;
    (pCVar4->cmd).name.d.d = pDVar6;
    pcVar7 = (t->cmd).name.d.ptr;
    (t->cmd).name.d.ptr = (char16_t *)0x0;
    (pCVar4->cmd).name.d.ptr = pcVar7;
    qVar3 = (t->cmd).name.d.size;
    (t->cmd).name.d.size = 0;
    (pCVar4->cmd).name.d.size = qVar3;
    pDVar6 = (t->cmd).type.d.d;
    (t->cmd).type.d.d = (Data *)0x0;
    (pCVar4->cmd).type.d.d = pDVar6;
    pcVar7 = (t->cmd).type.d.ptr;
    (t->cmd).type.d.ptr = (char16_t *)0x0;
    (pCVar4->cmd).type.d.ptr = pcVar7;
    qVar3 = (t->cmd).type.d.size;
    (t->cmd).type.d.size = 0;
    (pCVar4->cmd).type.d.size = qVar3;
    pDVar6 = (t->cmd).typeSuffix.d.d;
    (t->cmd).typeSuffix.d.d = (Data *)0x0;
    (pCVar4->cmd).typeSuffix.d.d = pDVar6;
    pcVar7 = (t->cmd).typeSuffix.d.ptr;
    (t->cmd).typeSuffix.d.ptr = (char16_t *)0x0;
    (pCVar4->cmd).typeSuffix.d.ptr = pcVar7;
    qVar3 = (t->cmd).typeSuffix.d.size;
    (t->cmd).typeSuffix.d.size = 0;
    (pCVar4->cmd).typeSuffix.d.size = qVar3;
    pDVar8 = (t->args).d.d;
    (t->args).d.d = (Data *)0x0;
    (pCVar4->args).d.d = pDVar8;
    pTVar9 = (t->args).d.ptr;
    (t->args).d.ptr = (TypedName *)0x0;
    (pCVar4->args).d.ptr = pTVar9;
    qVar3 = (t->args).d.size;
    (t->args).d.size = 0;
    (pCVar4->args).d.size = qVar3;
    pCVar4->deviceLevel = t->deviceLevel;
    this->size = this->size + 1;
  }
  else {
    pDVar6 = pCVar4[-1].cmd.name.d.d;
    pcVar7 = pCVar4[-1].cmd.name.d.ptr;
    pCVar4[-1].cmd.name.d.d = (Data *)0x0;
    pCVar4[-1].cmd.name.d.ptr = (char16_t *)0x0;
    (pCVar4->cmd).name.d.d = pDVar6;
    (pCVar4->cmd).name.d.ptr = pcVar7;
    qVar3 = pCVar4[-1].cmd.name.d.size;
    pCVar4[-1].cmd.name.d.size = 0;
    (pCVar4->cmd).name.d.size = qVar3;
    pDVar6 = pCVar4[-1].cmd.type.d.d;
    pcVar7 = pCVar4[-1].cmd.type.d.ptr;
    pCVar4[-1].cmd.type.d.d = (Data *)0x0;
    pCVar4[-1].cmd.type.d.ptr = (char16_t *)0x0;
    (pCVar4->cmd).type.d.d = pDVar6;
    (pCVar4->cmd).type.d.ptr = pcVar7;
    qVar3 = pCVar4[-1].cmd.type.d.size;
    pCVar4[-1].cmd.type.d.size = 0;
    (pCVar4->cmd).type.d.size = qVar3;
    pDVar6 = pCVar4[-1].cmd.typeSuffix.d.d;
    pcVar7 = pCVar4[-1].cmd.typeSuffix.d.ptr;
    pCVar4[-1].cmd.typeSuffix.d.d = (Data *)0x0;
    pCVar4[-1].cmd.typeSuffix.d.ptr = (char16_t *)0x0;
    (pCVar4->cmd).typeSuffix.d.d = pDVar6;
    (pCVar4->cmd).typeSuffix.d.ptr = pcVar7;
    qVar3 = pCVar4[-1].cmd.typeSuffix.d.size;
    pCVar4[-1].cmd.typeSuffix.d.size = 0;
    (pCVar4->cmd).typeSuffix.d.size = qVar3;
    pDVar8 = pCVar4[-1].args.d.d;
    pTVar9 = pCVar4[-1].args.d.ptr;
    pCVar4[-1].args.d.d = (Data *)0x0;
    pCVar4[-1].args.d.ptr = (TypedName *)0x0;
    (pCVar4->args).d.d = pDVar8;
    (pCVar4->args).d.ptr = pTVar9;
    qVar3 = pCVar4[-1].args.d.size;
    pCVar4[-1].args.d.size = 0;
    (pCVar4->args).d.size = qVar3;
    pCVar4->deviceLevel = pCVar4[-1].deviceLevel;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar12 = 0;
      lVar11 = 0;
      do {
        pCVar4 = this->last;
        puVar1 = (undefined8 *)((long)&(pCVar4->cmd).name.d.d + lVar12);
        uVar5 = *puVar1;
        uVar10 = puVar1[1];
        *puVar1 = puVar1[-0xd];
        puVar1[1] = puVar1[-0xc];
        puVar1[-0xd] = uVar5;
        puVar1[-0xc] = uVar10;
        uVar5 = puVar1[2];
        puVar1[2] = puVar1[-0xb];
        puVar1[-0xb] = uVar5;
        uVar5 = puVar1[3];
        uVar10 = puVar1[4];
        puVar1[3] = puVar1[-10];
        puVar1[4] = puVar1[-9];
        puVar1[-10] = uVar5;
        puVar1[-9] = uVar10;
        uVar5 = puVar1[5];
        puVar1[5] = puVar1[-8];
        puVar1[-8] = uVar5;
        uVar5 = puVar1[6];
        uVar10 = puVar1[7];
        puVar1[6] = puVar1[-7];
        puVar1[7] = puVar1[-6];
        puVar1[-7] = uVar5;
        puVar1[-6] = uVar10;
        uVar5 = puVar1[8];
        puVar1[8] = puVar1[-5];
        puVar1[-5] = uVar5;
        QArrayDataPointer<VkSpecParser::TypedName>::operator=
                  ((QArrayDataPointer<VkSpecParser::TypedName> *)(puVar1 + 9),
                   (QArrayDataPointer<VkSpecParser::TypedName> *)((long)pCVar4 + lVar12 + -0x20));
        *(undefined1 *)(puVar1 + 0xc) = *(undefined1 *)((long)pCVar4 + lVar12 + -8);
        lVar11 = lVar11 + -1;
        lVar12 = lVar12 + -0x68;
      } while (lVar11 != this->move);
    }
    pCVar4 = this->where;
    pDVar6 = (pCVar4->cmd).name.d.d;
    (pCVar4->cmd).name.d.d = (t->cmd).name.d.d;
    (t->cmd).name.d.d = pDVar6;
    pcVar7 = (pCVar4->cmd).name.d.ptr;
    (pCVar4->cmd).name.d.ptr = (t->cmd).name.d.ptr;
    (t->cmd).name.d.ptr = pcVar7;
    qVar3 = (pCVar4->cmd).name.d.size;
    (pCVar4->cmd).name.d.size = (t->cmd).name.d.size;
    (t->cmd).name.d.size = qVar3;
    pDVar6 = (pCVar4->cmd).type.d.d;
    (pCVar4->cmd).type.d.d = (t->cmd).type.d.d;
    (t->cmd).type.d.d = pDVar6;
    pcVar7 = (pCVar4->cmd).type.d.ptr;
    (pCVar4->cmd).type.d.ptr = (t->cmd).type.d.ptr;
    (t->cmd).type.d.ptr = pcVar7;
    qVar3 = (pCVar4->cmd).type.d.size;
    (pCVar4->cmd).type.d.size = (t->cmd).type.d.size;
    (t->cmd).type.d.size = qVar3;
    pDVar6 = (pCVar4->cmd).typeSuffix.d.d;
    (pCVar4->cmd).typeSuffix.d.d = (t->cmd).typeSuffix.d.d;
    (t->cmd).typeSuffix.d.d = pDVar6;
    pcVar7 = (pCVar4->cmd).typeSuffix.d.ptr;
    (pCVar4->cmd).typeSuffix.d.ptr = (t->cmd).typeSuffix.d.ptr;
    (t->cmd).typeSuffix.d.ptr = pcVar7;
    qVar3 = (pCVar4->cmd).typeSuffix.d.size;
    (pCVar4->cmd).typeSuffix.d.size = (t->cmd).typeSuffix.d.size;
    (t->cmd).typeSuffix.d.size = qVar3;
    QArrayDataPointer<VkSpecParser::TypedName>::operator=(&(pCVar4->args).d,&(t->args).d);
    pCVar4->deviceLevel = t->deviceLevel;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }